

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *args_2;
  DefParamSyntax *pDVar1;
  Token local_48;
  Token local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::DefParamAssignmentSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *)(__fn + 0x60),
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x98),(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefParamSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_38,args_2,&local_48);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DefParamSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DefParamSyntax>(
        *deepClone(node.attributes, alloc),
        node.defparam.deepClone(alloc),
        *deepClone(node.assignments, alloc),
        node.semi.deepClone(alloc)
    );
}